

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeMultiLoad(Vdbe *p,int iDest,char *zTypes,...)

{
  char cVar1;
  char *zP4;
  char in_AL;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  undefined8 in_RCX;
  ulong uVar5;
  int op;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f0 = &ap[0].overflow_arg_area;
  uVar4 = 0x18;
  lVar6 = 0;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  do {
    cVar1 = zTypes[lVar6];
    iVar2 = (int)lVar6;
    if (cVar1 == 'i') {
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        ppvVar3 = (void **)((long)local_d8 + uVar5);
      }
      else {
        ppvVar3 = local_f0;
        local_f0 = local_f0 + 1;
      }
      sqlite3VdbeAddOp3(p,0x46,*(int *)ppvVar3,iDest + iVar2,0);
    }
    else {
      if (cVar1 != 's') {
        if (cVar1 == '\0') {
          sqlite3VdbeAddOp3(p,0x51,iDest,iVar2,0);
        }
        return;
      }
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        ppvVar3 = (void **)((long)local_d8 + uVar5);
      }
      else {
        ppvVar3 = local_f0;
        local_f0 = local_f0 + 1;
      }
      zP4 = (char *)*ppvVar3;
      op = 0x49;
      if (zP4 != (char *)0x0) {
        op = 0x6e;
      }
      iVar2 = sqlite3VdbeAddOp3(p,op,0,iDest + iVar2,0);
      sqlite3VdbeChangeP4(p,iVar2,zP4,0);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMultiLoad(Vdbe *p, int iDest, const char *zTypes, ...){
  va_list ap;
  int i;
  char c;
  va_start(ap, zTypes);
  for(i=0; (c = zTypes[i])!=0; i++){
    if( c=='s' ){
      const char *z = va_arg(ap, const char*);
      sqlite3VdbeAddOp4(p, z==0 ? OP_Null : OP_String8, 0, iDest+i, 0, z, 0);
    }else if( c=='i' ){
      sqlite3VdbeAddOp2(p, OP_Integer, va_arg(ap, int), iDest+i);
    }else{
      goto skip_op_resultrow;
    }
  }
  sqlite3VdbeAddOp2(p, OP_ResultRow, iDest, i);
skip_op_resultrow:
  va_end(ap);
}